

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::SimpleGlob
               (string *glob,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,int type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Status SVar3;
  unsigned_long uVar4;
  char *pcVar5;
  undefined4 extraout_var;
  byte bVar6;
  ulong dindex;
  bool bVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  Directory d;
  string fname;
  string path;
  string sfname;
  string ppath;
  allocator<char> local_fd;
  int local_fc;
  Directory local_f8;
  string local_f0;
  ulong local_d0;
  string local_c8;
  long *local_a8;
  size_t local_a0;
  long local_98 [2];
  string local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  long *local_50 [2];
  long local_40 [2];
  ulong uVar7;
  
  local_fc = type;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(files,(files->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
  if ((glob->_M_dataplus)._M_p[glob->_M_string_length - 1] == '*') {
    cmsys::SystemTools::GetFilenamePath(&local_c8,glob);
    cmsys::SystemTools::GetFilenameName(&local_88,glob);
    std::__cxx11::string::substr((ulong)&local_f0,(ulong)&local_88);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_f0);
    paVar1 = &local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_c8._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x717312);
    }
    cmsys::Directory::Directory(&local_f8);
    SVar3 = cmsys::Directory::Load(&local_f8,&local_c8,(string *)0x0);
    dindex = 0;
    uVar7 = dindex;
    if (SVar3.Kind_ == Success) {
      local_d0 = 0;
      local_68 = files;
      while( true ) {
        uVar4 = cmsys::Directory::GetNumberOfFiles(&local_f8);
        uVar7 = local_d0;
        if (uVar4 <= dindex) break;
        pcVar5 = cmsys::Directory::GetFile(&local_f8,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,pcVar5,(allocator<char> *)&local_a8);
        iVar2 = std::__cxx11::string::compare((char *)&local_f0);
        if (iVar2 == 0) {
          bVar8 = false;
        }
        else {
          pcVar5 = cmsys::Directory::GetFile(&local_f8,dindex);
          std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar5,&local_fd);
          iVar2 = std::__cxx11::string::compare((char *)local_50);
          bVar8 = iVar2 != 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (bVar8) {
          local_f0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_c8._M_dataplus._M_p,
                     local_c8._M_dataplus._M_p + local_c8._M_string_length);
          if (local_c8._M_dataplus._M_p[local_c8._M_string_length - 1] != '/') {
            std::__cxx11::string::append((char *)&local_f0);
          }
          cmsys::Directory::GetFile(&local_f8,dindex);
          std::__cxx11::string::append((char *)&local_f0);
          pcVar5 = cmsys::Directory::GetFile(&local_f8,dindex);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,pcVar5,(allocator<char> *)&local_60);
          if (((local_fc < 1) || (bVar8 = cmsys::SystemTools::FileIsDirectory(&local_f0), !bVar8))
             && ((-1 < local_fc || (bVar8 = cmsys::SystemTools::FileIsDirectory(&local_f0), bVar8)))
             ) {
            local_60._M_len = local_a0;
            local_60._M_str = (char *)local_a8;
            __str._M_str = local_88._M_dataplus._M_p;
            __str._M_len = local_88._M_string_length;
            iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              (&local_60,0,local_88._M_string_length,__str);
            if (iVar2 == 0) {
              local_d0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_68,&local_f0);
            }
          }
          if (local_a8 != local_98) {
            operator_delete(local_a8,local_98[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != paVar1) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        dindex = (ulong)((int)dindex + 1);
      }
    }
    bVar6 = (byte)uVar7;
    cmsys::Directory::~Directory(&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar6 = 0;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmSystemTools::SimpleGlob(const std::string& glob,
                               std::vector<std::string>& files,
                               int type /* = 0 */)
{
  files.clear();
  if (glob.back() != '*') {
    return false;
  }
  std::string path = cmSystemTools::GetFilenamePath(glob);
  std::string ppath = cmSystemTools::GetFilenameName(glob);
  ppath = ppath.substr(0, ppath.size() - 1);
  if (path.empty()) {
    path = "/";
  }

  bool res = false;
  cmsys::Directory d;
  if (d.Load(path)) {
    for (unsigned int i = 0; i < d.GetNumberOfFiles(); ++i) {
      if ((std::string(d.GetFile(i)) != ".") &&
          (std::string(d.GetFile(i)) != "..")) {
        std::string fname = path;
        if (path.back() != '/') {
          fname += "/";
        }
        fname += d.GetFile(i);
        std::string sfname = d.GetFile(i);
        if (type > 0 && cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (type < 0 && !cmSystemTools::FileIsDirectory(fname)) {
          continue;
        }
        if (cmHasPrefix(sfname, ppath)) {
          files.push_back(fname);
          res = true;
        }
      }
    }
  }
  return res;
}